

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParamConstraint.hpp
# Opt level: O0

void __thiscall
OpenMD::
AndParamConstraint<OpenMD::GreaterThanConstraint<double>,_OpenMD::LessThanOrEqualToConstraint<double>_>
::AndParamConstraint
          (AndParamConstraint<OpenMD::GreaterThanConstraint<double>,_OpenMD::LessThanOrEqualToConstraint<double>_>
           *this,GreaterThanConstraint<double> *cons1,LessThanOrEqualToConstraint<double> *cons2)

{
  ostream *poVar1;
  string *in_RDI;
  stringstream iss;
  GreaterThanConstraint<double> *in_stack_fffffffffffffda8;
  GreaterThanConstraint<double> *in_stack_fffffffffffffdb0;
  string local_210 [32];
  string local_1f0 [32];
  string local_1d0 [32];
  stringstream local_1b0 [16];
  ostream local_1a0 [416];
  
  ParamConstraintFacade<OpenMD::AndParamConstraint<OpenMD::GreaterThanConstraint<double>,_OpenMD::LessThanOrEqualToConstraint<double>_>_>
  ::ParamConstraintFacade
            ((ParamConstraintFacade<OpenMD::AndParamConstraint<OpenMD::GreaterThanConstraint<double>,_OpenMD::LessThanOrEqualToConstraint<double>_>_>
              *)0x20820b);
  GreaterThanConstraint<double>::GreaterThanConstraint
            (in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8);
  LessThanOrEqualToConstraint<double>::LessThanOrEqualToConstraint
            ((LessThanOrEqualToConstraint<double> *)in_stack_fffffffffffffdb0,
             (LessThanOrEqualToConstraint<double> *)in_stack_fffffffffffffda8);
  std::__cxx11::stringstream::stringstream(local_1b0);
  poVar1 = std::operator<<(local_1a0,"(");
  ParamConstraintFacade<OpenMD::GreaterThanConstraint<double>>::getConstraintDescription_abi_cxx11_
            (&in_stack_fffffffffffffda8->
              super_ParamConstraintFacade<OpenMD::GreaterThanConstraint<double>_>);
  poVar1 = std::operator<<(poVar1,local_1d0);
  poVar1 = std::operator<<(poVar1," and ");
  ParamConstraintFacade<OpenMD::LessThanOrEqualToConstraint<double>>::
  getConstraintDescription_abi_cxx11_
            ((ParamConstraintFacade<OpenMD::LessThanOrEqualToConstraint<double>_> *)
             in_stack_fffffffffffffda8);
  poVar1 = std::operator<<(poVar1,local_1f0);
  std::operator<<(poVar1,")");
  std::__cxx11::string::~string(local_1f0);
  std::__cxx11::string::~string(local_1d0);
  std::__cxx11::stringstream::str();
  std::__cxx11::string::operator=(in_RDI,local_210);
  std::__cxx11::string::~string(local_210);
  std::__cxx11::stringstream::~stringstream(local_1b0);
  return;
}

Assistant:

AndParamConstraint(Cons1T cons1, Cons2T cons2) :
        cons1_(cons1), cons2_(cons2) {
      std::stringstream iss;
      iss << "(" << cons1_.getConstraintDescription() << " and "
          << cons2_.getConstraintDescription() << ")";
      this->description_ = iss.str();
    }